

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

t_operand __thiscall
xemmai::ast::t_object_put::f_emit
          (t_object_put *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_node *ptVar1;
  t_emit *ptVar2;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  undefined7 in_register_00000081;
  t_operand tVar3;
  
  ptVar1 = (this->v_target)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0,0);
  ptVar1 = (this->v_value)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0,0);
  t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
  ptVar2 = t_emit::operator<<(a_emit,c_instruction__OBJECT_PUT);
  ptVar2 = t_emit::operator<<(ptVar2,a_emit->v_stack - 2);
  ptVar2 = t_emit::operator<<(ptVar2,this->v_key);
  t_emit::operator<<(ptVar2,0);
  a_emit->v_stack = a_emit->v_stack - 1;
  t_emit::f_at(a_emit,&this->super_t_node);
  if ((int)CONCAT71(in_register_00000081,a_clear) != 0) {
    a_emit->v_stack = a_emit->v_stack - 1;
  }
  tVar3.field_1.v_integer = extraout_RDX.v_integer;
  tVar3._0_8_ = 4;
  return tVar3;
}

Assistant:

t_operand t_object_put::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	v_target->f_emit(a_emit, false, false);
	v_value->f_emit(a_emit, false, false);
	a_emit.f_emit_safe_point(this);
	a_emit << c_instruction__OBJECT_PUT << a_emit.v_stack - 2 << v_key << 0;
	a_emit.f_pop();
	a_emit.f_at(this);
	if (a_clear) a_emit.f_pop();
	return {};
}